

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

void repeat_cb(uv_timer_t *handle)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  puts("REPEAT_CB");
  if (handle == (uv_timer_t *)0x0) {
    pcVar2 = "handle != NULL";
    uStack_10 = 0x4a;
  }
  else {
    iVar1 = uv_is_active(handle);
    if (iVar1 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        uv_close(handle,repeat_close_cb);
        return;
      }
      return;
    }
    pcVar2 = "1 == uv_is_active((uv_handle_t*) handle)";
    uStack_10 = 0x4b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void repeat_cb(uv_timer_t* handle) {
  printf("REPEAT_CB\n");

  ASSERT(handle != NULL);
  ASSERT(1 == uv_is_active((uv_handle_t*) handle));

  repeat_cb_called++;

  if (repeat_cb_called == 5) {
    uv_close((uv_handle_t*)handle, repeat_close_cb);
  }
}